

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

Vec_Ptr_t * Gia_IsoCollectCosClasses(Gia_IsoMan_t *p,int fVerbose)

{
  int *piVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  bool bVar9;
  int nSize;
  int iBegin;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLevel;
  Vec_Ptr_t *vGroups;
  int fVerbose_local;
  Gia_IsoMan_t *p_local;
  
  p_00 = Vec_PtrAlloc(1000);
  iBegin = 0;
  while( true ) {
    iVar3 = Gia_ManPoNum(p->pGia);
    bVar9 = false;
    if (iBegin < iVar3) {
      _k = Gia_ManCo(p->pGia,iBegin);
      bVar9 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    piVar1 = p->pUniques;
    iVar3 = Gia_ObjId(p->pGia,_k);
    if (0 < piVar1[iVar3]) {
      pVVar8 = Vec_IntAlloc(1);
      Vec_IntPush(pVVar8,iBegin);
      Vec_PtrPush(p_00,pVVar8);
    }
    iBegin = iBegin + 1;
  }
  iBegin = 0;
  do {
    iVar3 = Vec_IntSize(p->vClasses);
    if (iVar3 <= iBegin + 1) {
      for (iBegin = 0; iVar3 = Vec_PtrSize(p_00), iBegin < iVar3; iBegin = iBegin + 1) {
        pVVar8 = (Vec_Int_t *)Vec_PtrEntry(p_00,iBegin);
        Vec_IntSort(pVVar8,0);
      }
      Vec_VecSortByFirstInt((Vec_Vec_t *)p_00,0);
      return p_00;
    }
    iVar3 = Vec_IntEntry(p->vClasses,iBegin);
    iVar4 = Vec_IntEntry(p->vClasses,iBegin + 1);
    for (nSize = 0; nSize < iVar4; nSize = nSize + 1) {
      pGVar2 = p->pGia;
      uVar5 = Gia_IsoGetItem(p,iVar3 + nSize);
      pGVar7 = Gia_ManObj(pGVar2,uVar5);
      iVar6 = Gia_ObjIsPo(p->pGia,pGVar7);
      if (iVar6 != 0) break;
    }
    if (nSize != iVar4) {
      pVVar8 = Vec_IntAlloc(8);
      for (nSize = 0; nSize < iVar4; nSize = nSize + 1) {
        pGVar2 = p->pGia;
        uVar5 = Gia_IsoGetItem(p,iVar3 + nSize);
        pGVar7 = Gia_ManObj(pGVar2,uVar5);
        iVar6 = Gia_ObjIsPo(p->pGia,pGVar7);
        if (iVar6 != 0) {
          iVar6 = Gia_ObjCioId(pGVar7);
          Vec_IntPush(pVVar8,iVar6);
        }
      }
      Vec_PtrPush(p_00,pVVar8);
    }
    iBegin = iBegin + 2;
  } while( true );
}

Assistant:

Vec_Ptr_t * Gia_IsoCollectCosClasses( Gia_IsoMan_t * p, int fVerbose )
{
    Vec_Ptr_t * vGroups;
    Vec_Int_t * vLevel;
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize;
    // add singletons
    vGroups = Vec_PtrAlloc( 1000 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        if ( p->pUniques[Gia_ObjId(p->pGia, pObj)] > 0 )
        {
            vLevel = Vec_IntAlloc( 1 );
            Vec_IntPush( vLevel, i );
            Vec_PtrPush( vGroups, vLevel );
        }

    // add groups
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                break;
        }
        if ( k == nSize )
            continue;
        vLevel = Vec_IntAlloc( 8 );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                Vec_IntPush( vLevel, Gia_ObjCioId(pObj) );
        }
        Vec_PtrPush( vGroups, vLevel );
    }
    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vGroups, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vGroups, 0 );
//    Vec_VecFree( (Vec_Vec_t *)vGroups );
//    return NULL;
    return vGroups;
}